

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

void __thiscall
VertexClustering::calcCurvature
          (VertexClustering *this,vector<VCFace_*,_std::allocator<VCFace_*>_> *faces)

{
  double *pdVar1;
  _Rb_tree_header *p_Var2;
  pointer ppVVar3;
  VCFace *f;
  VertexGroup *pVVar4;
  undefined1 auVar5 [16];
  _Base_ptr p_Var6;
  double *pdVar7;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar8;
  long lVar9;
  clock_t cVar10;
  long lVar11;
  pointer ppVVar12;
  VertexClustering *this_00;
  VertexClustering *this_01;
  int iVar13;
  int iVar14;
  Scalar tmp;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double extraout_XMM0_Qb;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  pts;
  Vector2d eValues;
  Matrix3d Stretch;
  Matrix3d o2w;
  set<int,_std::less<int>,_std::allocator<int>_> rings;
  vector<double,_std::allocator<double>_> poly;
  Matrix2d eVecs;
  undefined1 local_2b8 [104];
  ulong local_250;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_248;
  double local_228;
  double dStack_220;
  double local_218;
  double dStack_210;
  double local_208;
  double dStack_200;
  undefined1 local_1f8 [16];
  clock_t local_1e8;
  vector<VCFace_*,_std::allocator<VCFace_*>_> *local_1e0;
  double local_1d8;
  double local_1d0;
  Scalar local_1c8;
  Scalar local_1c0;
  Scalar local_1b8;
  double local_1b0;
  Scalar local_1a8;
  Scalar local_1a0;
  Scalar local_198;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_190;
  Vector2d local_178;
  Matrix<double,_3,_3,_0,_3,_3> local_168;
  Matrix3d local_120;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_d8;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  undefined1 local_70 [32];
  pointer ppVStack_50;
  double local_48;
  double dStack_40;
  
  printf("start to calculate curvature for %lu faces...\n",
         (long)(faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3);
  local_1e8 = clock();
  ppVVar12 = (faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppVVar3 = (faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_1e0 = faces;
  if (ppVVar12 != ppVVar3) {
    local_250 = (ulong)((long)ppVVar3 - (long)ppVVar12 >> 3) / 10;
    iVar14 = 1;
    p_Var2 = &local_d8._M_impl.super__Rb_tree_header;
    iVar13 = 0;
    do {
      f = *ppVVar12;
      collectRings((set<int,_std::less<int>,_std::allocator<int>_> *)&local_d8,this,f);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::vector(&local_190,local_d8._M_impl.super__Rb_tree_header._M_node_count,
               (allocator_type *)&local_120);
      if ((_Rb_tree_header *)local_d8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
        dVar20 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
        dVar18 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
        dVar17 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
        pVVar4 = this->vGroup;
        pdVar7 = ((local_190.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                 array + 2;
        p_Var6 = local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          lVar11 = (long)(int)p_Var6[1]._M_color * 0x50;
          dVar21 = *(double *)(&pVVar4->field_0x18 + lVar11);
          pdVar1 = (double *)(&pVVar4->field_0x8 + lVar11);
          dVar22 = pdVar1[1];
          ((plain_array<double,_3,_0,_0> *)(pdVar7 + -2))->array[0] = *pdVar1 - dVar20;
          pdVar7[-1] = dVar22 - dVar18;
          *pdVar7 = dVar21 - dVar17;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
          pdVar7 = pdVar7 + 3;
        } while ((_Rb_tree_header *)p_Var6 != p_Var2);
      }
      this_00 = (VertexClustering *)&f->normal;
      make_coord_space(&local_120,(Vector3d *)this_00);
      dVar21 = local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3];
      dVar18 = local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2];
      dVar20 = local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1];
      dVar17 = local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0];
      if ((long)local_190.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_190.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        lVar11 = ((long)local_190.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_190.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar11 = lVar11 + (ulong)(lVar11 == 0);
        pdVar7 = ((local_190.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                 array + 2;
        do {
          dVar22 = ((plain_array<double,_3,_0,_0> *)(pdVar7 + -2))->array[0];
          dVar23 = pdVar7[-1];
          dVar15 = *pdVar7;
          ((plain_array<double,_3,_0,_0> *)(pdVar7 + -2))->array[0] =
               dVar15 * local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[2] +
               dVar23 * local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[1] +
               dVar22 * local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[0];
          pdVar7[-1] = dVar15 * local_120.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5] +
                       dVar23 * local_120.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4] +
                       dVar22 * local_120.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3];
          *pdVar7 = local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[8] * dVar15 +
                    local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[7] * dVar23 +
                    local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[6] * dVar22;
          pdVar7 = pdVar7 + 3;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      this_01 = (VertexClustering *)local_70;
      leastSquareFitting((vector<double,_std::allocator<double>_> *)local_70,this_00,&local_190);
      dVar15 = localCurvature(this_01,(vector<double,_std::allocator<double>_> *)local_70,&local_178
                              ,(Matrix2d *)(local_70 + 0x18));
      dVar23 = local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5];
      dVar22 = local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[4];
      f->area = dVar15 * f->area;
      if ((this->opts).anisotropic == true) {
        local_1f8._0_8_ =
             (double)ppVStack_50 *
             local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] + (double)local_70._24_8_ * dVar20;
        local_1f8._8_8_ =
             (double)ppVStack_50 *
             local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] + (double)local_70._24_8_ * dVar18;
        local_208 = dVar21 * (double)ppVStack_50 + dVar17 * (double)local_70._24_8_;
        dVar15 = (double)local_1f8._8_8_ * (double)local_1f8._8_8_ +
                 (double)local_1f8._0_8_ * (double)local_1f8._0_8_;
        dVar16 = local_208 * local_208 + dVar15;
        dStack_200 = dVar15;
        if (dVar16 < 0.0) {
          local_228 = sqrt(dVar16);
          dVar15 = extraout_XMM0_Qb;
        }
        else {
          local_228 = SQRT(dVar16);
        }
        local_2b8._0_8_ = dStack_40 * dVar23 + dVar18 * local_48;
        local_2b8._8_8_ = local_48 * dVar17 + dVar21 * dStack_40;
        dVar20 = dVar22 * dStack_40 + dVar20 * local_48;
        dVar17 = (double)local_2b8._8_8_ * (double)local_2b8._8_8_ +
                 dVar20 * dVar20 + (double)local_2b8._0_8_ * (double)local_2b8._0_8_;
        dStack_220 = dVar15;
        if (dVar17 < 0.0) {
          dVar17 = sqrt(dVar17);
        }
        else {
          dVar17 = SQRT(dVar17);
        }
        dVar18 = ABS(local_178.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                     m_storage.m_data.array[0]);
        local_248.m_xpr = &local_168;
        local_248.m_row = 0;
        local_248.m_col = 1;
        local_248.m_currentBlockRows = 1;
        local_198 = 0.0;
        local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = dVar18;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (&local_248,&local_198);
        local_1a0 = 0.0;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (pCVar8,&local_1a0);
        local_1a8 = 0.0;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (pCVar8,&local_1a8);
        local_218 = ABS(local_178.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                        m_storage.m_data.array[1]);
        dStack_210 = 0.0;
        local_1b0 = local_218;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (pCVar8,&local_1b0);
        local_1b8 = 0.0;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (pCVar8,&local_1b8);
        local_1c0 = 0.0;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (pCVar8,&local_1c0);
        local_1c8 = 0.0;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                           (pCVar8,&local_1c8);
        local_1d8 = local_218;
        pdVar7 = &local_1d0;
        if (dVar18 < local_218) {
          pdVar7 = &local_1d8;
        }
        local_1d0 = dVar18;
        Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar8,pdVar7);
        if ((local_248.m_currentBlockRows + local_248.m_row != 3) || (local_248.m_col != 3)) {
          __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/CommaInitializer.h"
                        ,0x6f,
                        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
                       );
        }
        local_208 = local_208 / local_228;
        auVar25._8_8_ = local_228;
        auVar25._0_8_ = local_228;
        local_1f8 = divpd(local_1f8,auVar25);
        dStack_80 = dVar20 / dVar17;
        auVar5._8_8_ = dVar17;
        auVar5._0_8_ = dVar17;
        auVar25 = divpd(local_2b8._0_16_,auVar5);
        dVar20 = local_1f8._0_8_;
        local_98 = local_1f8._8_8_;
        dVar24 = auVar25._0_8_;
        local_218 = auVar25._8_8_;
        dVar15 = dVar20 * dVar24 - dStack_80 * local_98;
        dVar16 = local_98 * local_218 - dVar24 * local_208;
        dVar26 = local_208 * dStack_80 - local_218 * dVar20;
        dVar17 = dVar26 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[2] +
                 dVar24 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[1] +
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0] * local_98;
        dVar28 = dVar26 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[5] +
                 dVar24 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[4] +
                 local_98 *
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3];
        local_a8 = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[8];
        uStack_a0 = 0;
        dVar27 = dVar26 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[8] +
                 dVar24 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[7] +
                 local_98 *
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6];
        local_228 = dVar27 * dVar26 + dVar28 * dVar24 + local_98 * dVar17;
        dStack_220 = dStack_200;
        dVar18 = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2] * dVar15 +
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1] * local_218 +
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0] * local_208;
        dVar21 = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2] * dVar16 +
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1] * dStack_80 +
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0] * dVar20;
        dVar22 = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] * dVar15 +
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] * local_218 +
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3] * local_208;
        dVar23 = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] * dVar16 +
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] * dStack_80 +
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3] * dVar20;
        dVar29 = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] * dVar15 +
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7] * local_218 +
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6] * local_208;
        dVar30 = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] * dVar16 +
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7] * dStack_80 +
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[6] * dVar20;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [0] = dVar15 * dVar29 + local_218 * dVar22 + local_208 * dVar18;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [1] = dVar15 * dVar30 + local_218 * dVar23 + local_208 * dVar21;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [2] = dVar27 * dVar15 + local_218 * dVar28 + dVar17 * local_208;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [3] = dVar29 * dVar16 + dVar22 * dStack_80 + dVar20 * dVar18;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [4] = dVar16 * dVar30 + dStack_80 * dVar23 + dVar21 * dVar20;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [5] = dVar16 * dVar27 + dStack_80 * dVar28 + dVar17 * dVar20;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [6] = dVar26 * dVar29 + dVar22 * dVar24 + local_98 * dVar18;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [7] = dVar26 * dVar30 + dVar23 * dVar24 + local_98 * dVar21;
        (f->K).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
        [8] = local_228;
        dStack_210 = local_218;
        dStack_90 = local_208;
        local_88 = local_218;
      }
      if ((int)local_250 <= iVar13) {
        printf("%%%d...\n",(ulong)(uint)(iVar14 * 10));
        lVar11 = (long)(local_1e0->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(local_1e0->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
                       super__Vector_impl_data._M_start;
        lVar9 = lVar11 >> 3;
        auVar19._8_4_ = (int)(lVar11 >> 0x23);
        auVar19._0_8_ = lVar9;
        auVar19._12_4_ = 0x45300000;
        iVar14 = iVar14 + 1;
        local_250 = (ulong)(uint)(int)((double)iVar14 *
                                      (((auVar19._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0
                                       )) / 10.0));
      }
      if ((VertexGroup *)local_70._0_8_ != (VertexGroup *)0x0) {
        operator_delete((void *)local_70._0_8_);
      }
      if (local_190.
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_190.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar13 = iVar13 + 1;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_d8);
      ppVVar12 = ppVVar12 + 1;
    } while (ppVVar12 != ppVVar3);
  }
  cVar10 = clock();
  printf("Done, uses %lf s for curvature.\n",(double)(cVar10 - local_1e8) / 1000000.0);
  return;
}

Assistant:

void VertexClustering::calcCurvature(vector<VCFace*> & faces)
{
	printf("start to calculate curvature for %lu faces...\n", faces.size());
	clock_t start = clock();
	int cnt = 0, n10 = faces.size() / 10, percent = 1;
	for (VCFace* f : faces) {
		set<int> rings(collectRings(f));
		vector<Vector3d> pts(rings.size());
		int i = 0;
		Vector3d origin = f->center;
		for (int id : rings)
			pts[i++] = vGroup->group[id].pos - origin;
		Matrix3d o2w;
		make_coord_space(o2w, f->normal);
		Matrix3d w2o = o2w.transpose();
		for (i = 0; i < pts.size(); i++) {
			pts[i] = w2o * pts[i]; //now pts are in object coordinate
		}
		vector<double> poly(leastSquareFitting(pts));
		Matrix2d eVecs;
		Vector2d eValues;
		double weight = localCurvature(poly, eValues, eVecs);
		f->area *= weight;       //update density based on curvature
		if (opts.anisotropic) {  
			//D1, D2 are the priciple directions in xyz coordinate, their eigenvalues are principle curvatures
			Vector3d D1 = (o2w.col(0) * eVecs(0, 0) + o2w.col(1) * eVecs(1, 0)).normalized();
			Vector3d D2 = (o2w.col(0) * eVecs(0, 1) + o2w.col(1) * eVecs(1, 1)).normalized();
			Matrix3d Rotation;
			Rotation.col(0) = D1;
			Rotation.col(1) = D2;
			Rotation.col(2) = D1.cross(D2);
			Matrix3d Stretch;
			Stretch << fabs(eValues(0)), 0, 0,
				0, fabs(eValues(1)), 0,
				0, 0, max(fabs(eValues(0)), fabs(eValues(1)));
			f->K = Rotation * Stretch * Rotation.transpose(); //compute the Riemannian metric
		}
		if (++cnt > n10) {
			printf("%%%d...\n", 10 * percent);
			n10 = faces.size() / 10.0 * ++percent;
		}
	}
	printf("Done, uses %lf s for curvature.\n", (double)(clock() - start) / CLOCKS_PER_SEC);
}